

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clique.cpp
# Opt level: O0

ostream * operator<<(ostream *ostream,Clique *clique)

{
  ostream *this;
  bool bVar1;
  alignment_id_t aVar2;
  AlignmentRecord *this_00;
  ostream *poVar3;
  reference puVar4;
  int iVar5;
  long in_RSI;
  ostream *in_RDI;
  const_iterator it;
  int n;
  size_t i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> ids;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff50;
  size_type in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_50;
  int local_44;
  alignment_id_t local_40;
  size_type local_30;
  long local_10;
  ostream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x25ee14);
  local_30 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_first
                       ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x25ee25);
  while (local_30 != 0xffffffffffffffff) {
    this_00 = (AlignmentRecord *)
              (**(code **)(**(long **)(local_10 + 0x28) + 0x28))
                        (*(long **)(local_10 + 0x28),local_30);
    aVar2 = AlignmentRecord::getID(this_00);
    local_40 = aVar2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (in_stack_ffffffffffffff50,(value_type_conflict1 *)in_stack_ffffffffffffff48);
    in_stack_ffffffffffffff80 =
         boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_next
                   ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                    CONCAT44(aVar2,in_stack_ffffffffffffff88),in_stack_ffffffffffffff80);
    local_30 = in_stack_ffffffffffffff80;
  }
  poVar3 = std::operator<<(local_8,"[");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(ulong *)(local_10 + 8));
  poVar3 = std::operator<<(poVar3,":");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(ulong *)(local_10 + 0x10));
  std::operator<<(poVar3,"]");
  std::operator<<(local_8,"(");
  local_44 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(in_stack_ffffffffffffff48);
  __gnu_cxx::
  __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
  __normal_iterator<unsigned_int*>
            ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              *)in_stack_ffffffffffffff50,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              *)in_stack_ffffffffffffff48);
  while( true ) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(in_stack_ffffffffffffff48);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)in_stack_ffffffffffffff50,
                       (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)in_stack_ffffffffffffff48);
    if (!bVar1) break;
    iVar5 = local_44 + 1;
    bVar1 = 0 < local_44;
    local_44 = iVar5;
    if (bVar1) {
      std::operator<<(local_8,",");
    }
    this = local_8;
    puVar4 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&local_50);
    std::ostream::operator<<(this,*puVar4);
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&local_50);
  }
  std::operator<<(local_8,")");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)poVar3);
  return local_8;
}

Assistant:

ostream& operator<<(ostream& ostream, const Clique& clique) {
	vector<alignment_id_t> ids;
	for (size_t i=clique.alignment_set->find_first(); i!=alignment_set_t::npos; i=clique.alignment_set->find_next(i)) {
		ids.push_back(clique.parent.getAlignmentByIndex(i).getID());
	}
	//sort(ids.begin(), ids.end());
	ostream << "[" << clique.leftmost_segment_start << ":" << clique.rightmost_segment_end << "]";
	ostream << "(";
	int n = 0;
	vector<alignment_id_t>::const_iterator it = ids.begin();
	for (; it!=ids.end(); ++it) {
		if (n++>0) ostream << ",";
		ostream << *it;
	}
	ostream << ")";
	return ostream;
}